

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzz-test.c++
# Opt level: O2

void __thiscall
capnp::_::anon_unknown_0::traverseCatchingExceptions<capnp::_::(anonymous_namespace)::TextChecker>
          (anon_unknown_0 *this,ArrayPtr<const_capnp::word> data)

{
  word *pwVar1;
  long lVar2;
  Reader RVar3;
  MessageSizeCounts MVar4;
  ArrayPtr<const_capnp::word> array;
  ArrayPtr<const_capnp::word> array_00;
  ArrayPtr<const_capnp::word> array_01;
  ArrayPtr<const_capnp::word> array_02;
  ArrayPtr<capnp::word> firstSegment;
  ReaderOptions options;
  ReaderOptions options_00;
  ReaderOptions options_01;
  ReaderOptions options_02;
  DebugComparison<unsigned_int,_int> _kjCondition_3;
  Builder local_c40;
  DebugComparison<unsigned_int,_int> _kjCondition;
  PointerReader in_stack_fffffffffffff480;
  Reader local_a98;
  FlatArrayMessageReader reader_3;
  FlatArrayMessageReader reader;
  FlatArrayMessageReader reader_1;
  FlatArrayMessageReader reader_2;
  NullableValue<kj::Exception> local_678;
  NullableValue<kj::Exception> local_4e0;
  NullableValue<kj::Exception> local_348;
  NullableValue<kj::Exception> local_1b0;
  
  pwVar1 = data.ptr;
  array.size_ = (size_t)pwVar1;
  array.ptr = (word *)this;
  options._8_8_ = 0x40;
  options.traversalLimitInWords = 0x800000;
  FlatArrayMessageReader::FlatArrayMessageReader(&reader,array,options);
  RVar3 = MessageReader::getRoot<capnp::Text>(&reader.super_MessageReader);
  _kjCondition.left = 0;
  for (lVar2 = 0; RVar3.super_StringPtr.content.size_ - 1 != lVar2; lVar2 = lVar2 + 1) {
    _kjCondition.left = _kjCondition.left + (int)RVar3.super_StringPtr.content.ptr[lVar2];
  }
  _kjCondition.right = 0;
  _kjCondition.op.content.ptr = " != ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.left != 0;
  if (_kjCondition.left == 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,int>&>
              ((Fault *)&reader_3,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/fuzz-test.c++"
               ,0x75,FAILED,"Checker::check(reader) != 0","_kjCondition,",&_kjCondition);
    kj::_::Debug::Fault::~Fault((Fault *)&reader_3);
  }
  FlatArrayMessageReader::~FlatArrayMessageReader(&reader);
  local_1b0.isSet = false;
  kj::_::NullableValue<kj::Exception>::~NullableValue(&local_1b0);
  array_00.size_ = (size_t)pwVar1;
  array_00.ptr = (word *)this;
  options_00._8_8_ = 0x40;
  options_00.traversalLimitInWords = 0x800000;
  FlatArrayMessageReader::FlatArrayMessageReader(&reader_1,array_00,options_00);
  MessageReader::getRootInternal(&local_a98,&reader_1.super_MessageReader);
  _kjCondition._0_8_ = traverse((Reader)in_stack_fffffffffffff480);
  _kjCondition.op.content.ptr = (char *)((ulong)_kjCondition.op.content.ptr & 0xffffffff00000000);
  _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_b81a;
  _kjCondition.result = true;
  _kjCondition._25_7_ = 0;
  if (_kjCondition._0_8_ == 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&>
              ((Fault *)&reader_3,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/fuzz-test.c++"
               ,0x7b,FAILED,"traverse(reader.getRoot<AnyPointer>()) != 0","_kjCondition,",
               (DebugComparison<unsigned_long,_int> *)&_kjCondition);
    kj::_::Debug::Fault::~Fault((Fault *)&reader_3);
  }
  FlatArrayMessageReader::~FlatArrayMessageReader(&reader_1);
  local_348.isSet = false;
  kj::_::NullableValue<kj::Exception>::~NullableValue(&local_348);
  array_01.size_ = (size_t)pwVar1;
  array_01.ptr = (word *)this;
  options_01._8_8_ = 0x40;
  options_01.traversalLimitInWords = 0x800000;
  FlatArrayMessageReader::FlatArrayMessageReader(&reader_2,array_01,options_01);
  MessageReader::getRootInternal((Reader *)&reader_3,&reader_2.super_MessageReader);
  MVar4 = PointerReader::targetSize((PointerReader *)&reader_3);
  _kjCondition._0_8_ = MVar4.wordCount;
  _kjCondition.op.content.ptr = (char *)((ulong)_kjCondition.op.content.ptr & 0xffffffff00000000);
  _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_b81a;
  _kjCondition.result = true;
  _kjCondition._25_7_ = 0;
  if (_kjCondition._0_8_ == 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&>
              ((Fault *)&reader_3,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/fuzz-test.c++"
               ,0x81,FAILED,"reader.getRoot<AnyPointer>().targetSize().wordCount != 0",
               "_kjCondition,",(DebugComparison<unsigned_long,_int> *)&_kjCondition);
    kj::_::Debug::Fault::~Fault((Fault *)&reader_3);
  }
  FlatArrayMessageReader::~FlatArrayMessageReader(&reader_2);
  local_4e0.isSet = false;
  kj::_::NullableValue<kj::Exception>::~NullableValue(&local_4e0);
  array_02.size_ = (size_t)pwVar1;
  array_02.ptr = (word *)this;
  options_02._8_8_ = 0x40;
  options_02.traversalLimitInWords = 0x800000;
  FlatArrayMessageReader::FlatArrayMessageReader(&reader_3,array_02,options_02);
  firstSegment.size_ = 0x2000;
  firstSegment.ptr =
       traverseCatchingExceptions<capnp::_::(anonymous_namespace)::TextChecker>::buffer;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)&_kjCondition,firstSegment,GROW_HEURISTICALLY);
  MessageReader::getRootInternal((Reader *)&_kjCondition_3,&reader_3.super_MessageReader);
  MessageBuilder::setRoot<capnp::AnyPointer::Reader>
            ((MessageBuilder *)&_kjCondition,(Reader *)&_kjCondition_3);
  MessageBuilder::getRoot<capnp::Text>(&local_c40,(MessageBuilder *)&_kjCondition);
  _kjCondition_3.left = 0;
  for (lVar2 = 0; local_c40.content.size_ - 1 != lVar2; lVar2 = lVar2 + 1) {
    _kjCondition_3.left = _kjCondition_3.left + (int)local_c40.content.ptr[lVar2];
  }
  _kjCondition_3.right = 0;
  _kjCondition_3.op.content.ptr = " != ";
  _kjCondition_3.op.content.size_ = 5;
  _kjCondition_3.result = _kjCondition_3.left != 0;
  if (!_kjCondition_3.result) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,int>&>
              ((Fault *)&local_c40,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/fuzz-test.c++"
               ,0x8a,FAILED,"Checker::check(copyBuilder) != 0","_kjCondition,",&_kjCondition_3);
    kj::_::Debug::Fault::~Fault((Fault *)&local_c40);
  }
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&_kjCondition);
  FlatArrayMessageReader::~FlatArrayMessageReader(&reader_3);
  local_678.isSet = false;
  kj::_::NullableValue<kj::Exception>::~NullableValue(&local_678);
  return;
}

Assistant:

void traverseCatchingExceptions(kj::ArrayPtr<const word> data) {
  // Try traversing through Checker.
  kj::runCatchingExceptions([&]() {
    FlatArrayMessageReader reader(data);
    KJ_ASSERT(Checker::check(reader) != 0) { break; }
  });

  // Try traversing through AnyPointer.
  kj::runCatchingExceptions([&]() {
    FlatArrayMessageReader reader(data);
    KJ_ASSERT(traverse(reader.getRoot<AnyPointer>()) != 0) { break; }
  });

  // Try counting the size..
  kj::runCatchingExceptions([&]() {
    FlatArrayMessageReader reader(data);
    KJ_ASSERT(reader.getRoot<AnyPointer>().targetSize().wordCount != 0) { break; }
  });

  // Try copying into a builder, and if that works, traversing it with Checker.
  static word buffer[8192];
  kj::runCatchingExceptions([&]() {
    FlatArrayMessageReader reader(data);
    MallocMessageBuilder copyBuilder(buffer);
    copyBuilder.setRoot(reader.getRoot<AnyPointer>());
    KJ_ASSERT(Checker::check(copyBuilder) != 0) { break; }
  });
}